

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane-test.c++
# Opt level: O0

void __thiscall
capnp::_::anon_unknown_0::MembranePolicyImpl::~MembranePolicyImpl(MembranePolicyImpl *this)

{
  MembranePolicyImpl *this_local;
  
  ~MembranePolicyImpl(this);
  operator_delete(this,0xc0);
  return;
}

Assistant:

MembranePolicyImpl() = default;